

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

void __thiscall tf::TaskQueue<tf::Node_*>::TaskQueue(TaskQueue<tf::Node_*> *this,int64_t c)

{
  Array *this_00;
  int64_t c_local;
  TaskQueue<tf::Node_*> *this_local;
  memory_order __b_1;
  memory_order __b;
  
  std::atomic<long>::atomic(&this->_top);
  std::atomic<long>::atomic(&this->_bottom);
  std::atomic<tf::TaskQueue<tf::Node_*>::Array_*>::atomic(&this->_array);
  std::
  vector<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>::
  vector(&this->_garbage);
  if (c != 0 && (c & c - 1U) == 0) {
    std::operator&(relaxed,__memory_order_mask);
    (this->_top).super___atomic_base<long>._M_i = 0;
    std::operator&(relaxed,__memory_order_mask);
    (this->_bottom).super___atomic_base<long>._M_i = 0;
    this_00 = (Array *)operator_new(0x18);
    Array::Array(this_00,c);
    std::atomic<tf::TaskQueue<tf::Node_*>::Array_*>::store(&this->_array,this_00,relaxed);
    std::
    vector<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
    ::reserve(&this->_garbage,0x20);
    return;
  }
  __assert_fail("c && (!(c & (c-1)))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/tsq.hpp"
                ,0x8c,"tf::TaskQueue<tf::Node *>::TaskQueue(int64_t) [T = tf::Node *]");
}

Assistant:

TaskQueue<T>::TaskQueue(int64_t c) {
  assert(c && (!(c & (c-1))));
  _top.store(0, std::memory_order_relaxed);
  _bottom.store(0, std::memory_order_relaxed);
  _array.store(new Array{c}, std::memory_order_relaxed);
  _garbage.reserve(32);
}